

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O2

bool __thiscall TcpServerImpl::Start(TcpServerImpl *this,char *szIpAddr,uint16_t sPort)

{
  addrinfo *paVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  undefined6 in_register_00000012;
  bool bVar5;
  addrinfo **__pai;
  uint32_t on;
  int32_t fd;
  undefined4 uStack_94;
  size_type local_90;
  addrinfo *lstAddr;
  TcpServerImpl *local_70;
  addrinfo local_68;
  
  __pai = (addrinfo **)&lstAddr;
  lstAddr = (addrinfo *)0x0;
  local_68.ai_canonname = (char *)0x0;
  local_68.ai_next = (addrinfo *)0x0;
  local_68.ai_addrlen = 0;
  local_68._20_4_ = 0;
  local_68.ai_addr = (sockaddr *)0x0;
  local_68.ai_socktype = 1;
  local_68.ai_protocol = 0;
  local_68.ai_flags = 1;
  local_68.ai_family = 0;
  std::__cxx11::to_string((string *)&fd,(int)CONCAT62(in_register_00000012,sPort));
  iVar2 = getaddrinfo(szIpAddr,(char *)_fd,&local_68,__pai);
  std::__cxx11::string::~string((string *)&fd);
  if (iVar2 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iVar2 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      fd = iVar2;
      if (iVar2 == -1) {
LAB_00117947:
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
      std::vector<int,_std::allocator<int>_>::push_back(&this->m_vSock,&fd);
      (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,&fd);
      if (paVar1->ai_family == 10) {
        on = 1;
        iVar2 = setsockopt(fd,0x29,0x1a,&on,4);
        if (iVar2 == -1) {
          piVar3 = (int *)__cxa_allocate_exception(4);
          piVar4 = __errno_location();
          *piVar3 = *piVar4;
          __cxa_throw(piVar3,&int::typeinfo,0);
        }
      }
      iVar2 = bind(fd,paVar1->ai_addr,paVar1->ai_addrlen);
      if (iVar2 < 0) goto LAB_00117947;
      __pai = &paVar1->ai_next;
    }
    piVar3 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (piVar3 != piVar4) {
      iVar2 = listen(*piVar3,0x1000);
      piVar3 = piVar3 + 1;
      if (iVar2 < 0) {
        piVar3 = (int *)__cxa_allocate_exception(4);
        piVar4 = __errno_location();
        *piVar3 = *piVar4;
        __cxa_throw(piVar3,&int::typeinfo,0);
      }
    }
    (this->super_BaseSocketImpl).m_bStop = false;
    _fd = SelectThread;
    local_90 = 0;
    local_70 = this;
    std::thread::thread<void(TcpServerImpl::*)(),TcpServerImpl*,void>
              ((thread *)&on,(type *)&fd,&local_70);
    std::thread::operator=(&(this->super_BaseSocketImpl).m_thListen,(thread *)&on);
    std::thread::~thread((thread *)&on);
    bVar5 = true;
    freeaddrinfo((addrinfo *)lstAddr);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool TcpServerImpl::Start(const char* const szIpAddr, const uint16_t sPort)
{
    struct addrinfo *lstAddr{}, hint{};
    hint.ai_family = AF_UNSPEC;
    hint.ai_socktype = SOCK_STREAM;
    hint.ai_flags = AI_PASSIVE;

    if (::getaddrinfo(szIpAddr, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        for (auto curAddr = lstAddr; curAddr != nullptr; curAddr = curAddr->ai_next)
        {
            const SOCKET fd = ::socket(curAddr->ai_family, curAddr->ai_socktype, curAddr->ai_protocol);
            if (fd == INVALID_SOCKET)
                throw WSAGetLastError();

            m_vSock.push_back(fd);

            SetSocketOption(fd);

            if (curAddr->ai_family == AF_INET6)
            {
                constexpr uint32_t on = 1;
                if (::setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                    throw WSAGetLastError();
            }

            if (::bind(fd, curAddr->ai_addr, static_cast<int>(curAddr->ai_addrlen)) < 0)
                throw WSAGetLastError();    // https://docs.microsoft.com/de-de/troubleshoot/windows-server/backup-and-storage/error-10013-wsaeacces-is-returned
        }                                   // netsh int ipv4 show excludedportrange protocol = tcp

        for (auto fSock : m_vSock)
        {
            if (::listen(fSock, SOMAXCONN) < 0)
                throw WSAGetLastError();
        }

        m_bStop = false;
        m_thListen = thread(&TcpServerImpl::SelectThread, this);
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;
        Delete();
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}